

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O0

void thread_check_stack(void *arg)

{
  int iVar1;
  pthread_t __th;
  rlim_t local_c8;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  pthread_attr_t attr;
  size_t stack_size;
  rlimit lim;
  size_t expected;
  void *arg_local;
  
  iVar1 = getrlimit64(RLIMIT_STACK,(rlimit64 *)&stack_size);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xe7,"getrlimit(RLIMIT_STACK, &lim)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (stack_size == 0xffffffffffffffff) {
    stack_size = 0x200000;
  }
  __th = pthread_self();
  iVar1 = pthread_getattr_np(__th,(pthread_attr_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xea,"pthread_getattr_np(pthread_self(), &attr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = pthread_attr_getstacksize((pthread_attr_t *)&eval_a,(size_t *)(attr.__size + 0x30));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xeb,"pthread_attr_getstacksize(&attr, &stack_size)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (arg == (void *)0x0) {
    local_c8 = 0;
  }
  else {
    local_c8 = *(rlim_t *)((long)arg + 8);
  }
  lim.rlim_max = local_c8;
  if (local_c8 == 0) {
    lim.rlim_max = stack_size;
  }
  if ((long)attr._48_8_ < (long)lim.rlim_max) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xef,"stack_size",">=","expected",attr._48_8_,">=",lim.rlim_max);
    abort();
  }
  iVar1 = pthread_attr_destroy((pthread_attr_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xf0,"pthread_attr_destroy(&attr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void thread_check_stack(void* arg) {
#if defined(__APPLE__)
  size_t expected;
  expected = arg == NULL ? 0 : ((uv_thread_options_t*)arg)->stack_size;
  /* 512 kB is the default stack size of threads other than the main thread
   * on MacOS. */
  if (expected == 0)
    expected = 512 * 1024;
  ASSERT_GE(pthread_get_stacksize_np(pthread_self()), expected);
#elif defined(__linux__) && defined(__GLIBC__)
  size_t expected;
  struct rlimit lim;
  size_t stack_size;
  pthread_attr_t attr;
  ASSERT_OK(getrlimit(RLIMIT_STACK, &lim));
  if (lim.rlim_cur == RLIM_INFINITY)
    lim.rlim_cur = 2 << 20;  /* glibc default. */
  ASSERT_OK(pthread_getattr_np(pthread_self(), &attr));
  ASSERT_OK(pthread_attr_getstacksize(&attr, &stack_size));
  expected = arg == NULL ? 0 : ((uv_thread_options_t*)arg)->stack_size;
  if (expected == 0)
    expected = (size_t)lim.rlim_cur;
  ASSERT_GE(stack_size, expected);
  ASSERT_OK(pthread_attr_destroy(&attr));
#endif
}